

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertTest.cpp
# Opt level: O0

int main(void)

{
  LinkedList *this;
  LinkedList *local_30;
  Node *loopInstance;
  int i;
  LinkedList *test;
  Node *head;
  
  head._4_4_ = 0;
  test = (LinkedList *)0x0;
  this = (LinkedList *)operator_new(1);
  for (loopInstance._4_4_ = 0; loopInstance._4_4_ < 100; loopInstance._4_4_ = loopInstance._4_4_ + 1
      ) {
    LinkedList::prepend(this,(Node **)&test,loopInstance._4_4_ + 1);
  }
  LinkedList::insert(this,(Node **)&test,200,1);
  LinkedList::insert(this,(Node **)&test,200,100);
  for (local_30 = test; *(long *)(local_30 + 8) != 0; local_30 = *(LinkedList **)(local_30 + 8)) {
  }
  if ((**(int **)(test + 8) == 200) && (*(int *)local_30 == 200)) {
    head._4_4_ = 0;
  }
  else {
    head._4_4_ = 1;
  }
  return head._4_4_;
}

Assistant:

int main() {
	Node* head = nullptr;
	LinkedList* test = new LinkedList();

	for (int i = 0; i < 100; i++) {
		test->prepend(&head, i + 1);
	}

	test->insert(&head, 200, 1);
	test->insert(&head, 200, 100);

    Node* loopInstance = head;
    while (loopInstance->next != nullptr) {
		loopInstance = loopInstance->next;
	}

    if (head->next->data == 200 && loopInstance->data == 200) {
		return 0;
	} else {
		return 1;
	}
}